

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtag_fsm.cpp
# Opt level: O3

State Jtag_fsm::getStateFromName(string *s)

{
  int iVar1;
  ostream *poVar2;
  State SVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)s);
  SVar3 = TEST_LOGIC_RESET;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)s);
    if (iVar1 == 0) {
      SVar3 = RUN_TEST_IDLE;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)s);
      if (iVar1 == 0) {
        SVar3 = SELECT_DR_SCAN;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)s);
        if (iVar1 == 0) {
          SVar3 = CAPTURE_DR;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)s);
          if (iVar1 == 0) {
            SVar3 = SHIFT_DR;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)s);
            if (iVar1 == 0) {
              SVar3 = EXIT1_DR;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)s);
              if (iVar1 == 0) {
                SVar3 = PAUSE_DR;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)s);
                if (iVar1 == 0) {
                  SVar3 = EXIT2_DR;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)s);
                  if (iVar1 == 0) {
                    SVar3 = UPDATE_DR;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)s);
                    if (iVar1 == 0) {
                      SVar3 = SELECT_IR_SCAN;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)s);
                      if (iVar1 == 0) {
                        SVar3 = CAPTURE_IR;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)s);
                        if (iVar1 == 0) {
                          SVar3 = SHIFT_IR;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)s);
                          if (iVar1 == 0) {
                            SVar3 = EXIT1_IR;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)s);
                            if (iVar1 == 0) {
                              SVar3 = PAUSE_IR;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)s);
                              if (iVar1 == 0) {
                                SVar3 = EXIT2_IR;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)s);
                                if (iVar1 == 0) {
                                  SVar3 = UPDATE_IR;
                                }
                                else {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cerr,"ERROR! Invalid state name ",0x1a
                                            );
                                  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                                     ((ostream *)&std::cerr,(s->_M_dataplus)._M_p,
                                                      s->_M_string_length);
                                  std::endl<char,std::char_traits<char>>(poVar2);
                                  SVar3 = TEST_LOGIC_RESET;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return SVar3;
}

Assistant:

Jtag_fsm::State Jtag_fsm::getStateFromName(string s) {
	if (s == "RESET")
		return TEST_LOGIC_RESET;
	if (s == "IDLE")
		return RUN_TEST_IDLE;
	if (s == "DRSELECT")
		return SELECT_DR_SCAN;
	if (s == "DRCAPTURE")
		return CAPTURE_DR;
	if (s == "DRSHIFT")
		return SHIFT_DR;
	if (s == "DREXIT1")
		return EXIT1_DR;
	if (s == "DRPAUSE")
		return PAUSE_DR;
	if (s == "DREXIT2")
		return EXIT2_DR;
	if (s == "DRUPDATE")
		return UPDATE_DR;
	if (s == "IRSELECT")
		return SELECT_IR_SCAN;
	if (s == "IRCAPTURE")
		return CAPTURE_IR;
	if (s == "IRSHIFT")
		return SHIFT_IR;
	if (s == "IREXIT1")
		return EXIT1_IR;
	if (s == "IRPAUSE")
		return PAUSE_IR;
	if (s == "IREXIT2")
		return EXIT2_IR;
	if (s == "IRUPDATE")
		return UPDATE_IR;

	cerr << "ERROR! Invalid state name " << s << endl;
	return TEST_LOGIC_RESET;
}